

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool costScaleOk(vector<double,_std::allocator<double>_> *cost,HighsInt cost_scale,
                double infinite_cost)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (cost_scale == 0) {
    return true;
  }
  dVar6 = ldexp(1.0,cost_scale);
  pdVar2 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  while ((uVar4 != uVar5 &&
         ((dVar1 = pdVar2[uVar5], 0x7fefffffffffffff < (ulong)ABS(dVar1) ||
          (ABS(dVar1 * dVar6) <= infinite_cost))))) {
    uVar5 = uVar5 + 1;
  }
  return uVar4 == uVar5;
}

Assistant:

bool costScaleOk(const vector<double>& cost, const HighsInt cost_scale,
                 const double infinite_cost) {
  if (!cost_scale) return true;
  double cost_scale_value = std::pow(2, cost_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(cost.size()); iCol++)
    if (std::abs(cost[iCol]) < kHighsInf &&
        std::abs(cost[iCol] * cost_scale_value) > infinite_cost)
      return false;
  return true;
}